

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pushdown_window.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::FilterPushdown::PushdownWindow
          (FilterPushdown *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
  *this_00;
  pointer puVar1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  undefined8 uVar3;
  bool bVar4;
  pointer pLVar5;
  LogicalWindow *pLVar6;
  pointer pEVar7;
  BoundWindowExpression *pBVar8;
  BoundColumnRefExpression *pBVar9;
  pointer pFVar10;
  type expr;
  reference pvVar11;
  int iVar12;
  unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> *in_RDX;
  iterator __begin2;
  pointer this_01;
  ulong uVar13;
  long lVar14;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var15;
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
  *this_02;
  __node_base_ptr this_03;
  iterator __end2;
  column_binding_set_t partition_bindings;
  vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_true>
  window_exprs_partition_bindings;
  FilterPushdown pushdown;
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
  local_1e8;
  undefined1 local_1c8 [40];
  __buckets_ptr local_1a0;
  undefined1 auStack_198 [88];
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_140 [24];
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_128;
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f0;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
  local_b8;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
  local_88;
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
  local_48;
  
  pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>::
           operator->(in_RDX);
  pLVar6 = LogicalOperator::Cast<duckdb::LogicalWindow>(pLVar5);
  FilterPushdown((FilterPushdown *)(auStack_198 + 0x48),
                 (Optimizer *)
                 (op->
                 super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 )._M_t.
                 super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                 .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
                 *(bool *)&op[0x20].
                           super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                           .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl);
  auStack_198._16_8_ = (pointer)0x0;
  auStack_198._24_8_ = (pointer)0x0;
  auStack_198._32_8_ = (pointer)0x0;
  this_03 = (__node_base_ptr)
            (pLVar6->super_LogicalOperator).expressions.
            super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  auStack_198._40_8_ =
       (pLVar6->super_LogicalOperator).expressions.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (this_03 != (__node_base_ptr)auStack_198._40_8_) {
    do {
      pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                           *)this_03);
      iVar12 = 3;
      if ((pEVar7->super_BaseExpression).expression_class == BOUND_WINDOW) {
        pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                             *)this_03);
        pBVar8 = BaseExpression::Cast<duckdb::BoundWindowExpression>(&pEVar7->super_BaseExpression);
        this_01 = (pBVar8->partitions).
                  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  .
                  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar1 = (pBVar8->partitions).
                 super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (this_01 == puVar1) {
          _Var15._M_head_impl =
               (in_RDX->
               super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
          (in_RDX->
          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
               (LogicalOperator *)0x0;
          FinishPushdown(this,op);
          if (_Var15._M_head_impl != (LogicalOperator *)0x0) {
            (**(code **)((long)(_Var15._M_head_impl)->_vptr_LogicalOperator + 8))();
          }
          iVar12 = 1;
        }
        else {
          local_1c8._0_8_ = auStack_198;
          local_1c8._8_8_ = &DAT_00000001;
          local_1c8._16_8_ = (LogicalOperator *)0x0;
          local_1c8._24_8_ = (pointer)0x0;
          local_1c8._32_4_ = 1.0;
          local_1a0 = (__buckets_ptr)0x0;
          auStack_198._0_8_ = (__node_base_ptr)0x0;
          do {
            pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                     operator->(this_01);
            if ((pEVar7->super_BaseExpression).type == BOUND_COLUMN_REF) {
              pEVar7 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       ::operator->(this_01);
              pBVar9 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                                 (&pEVar7->super_BaseExpression);
              local_1e8.
              super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1c8;
              ::std::
              _Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<duckdb::ColumnBinding_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::ColumnBinding,true>>>>
                        ((_Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)local_1c8,&pBVar9->binding,&local_1e8);
            }
            this_01 = this_01 + 1;
          } while (this_01 != puVar1);
          ::std::
          vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
          ::push_back((vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
                       *)(auStack_198 + 0x10),(value_type *)local_1c8);
          ::std::
          _Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<duckdb::ColumnBinding,_duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>,_std::__detail::_Identity,_duckdb::ColumnBindingEquality,_duckdb::ColumnBindingHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_1c8);
          iVar12 = 0;
        }
      }
      if ((iVar12 != 3) && (iVar12 != 0)) goto LAB_00c92675;
      this_03 = this_03 + 1;
    } while (this_03 != (__node_base_ptr)auStack_198._40_8_);
  }
  if (auStack_198._16_8_ == auStack_198._24_8_) {
    _Var15._M_head_impl =
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    FinishPushdown(this,op);
    if (_Var15._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var15._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
  }
  else {
    local_1e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    _Var15._M_head_impl =
         op[0x21].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    if (op[0x22].
        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl != _Var15._M_head_impl
       ) {
      lVar14 = 0;
      this_00 = (vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
                 *)(auStack_198 + 0x30);
      uVar13 = 0;
      do {
        local_1c8._0_8_ = (LogicalOperator *)0x0;
        local_1c8._8_8_ = (ClientContext *)0x0;
        local_1c8._16_8_ = (LogicalOperator *)0x0;
        pFVar10 = unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                  ::operator->((unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                                *)((long)&(_Var15._M_head_impl)->_vptr_LogicalOperator + lVar14));
        expr = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator*(&pFVar10->filter);
        ExtractFilterBindings
                  ((FilterPushdown *)op,expr,(vector<duckdb::ColumnBinding,_true> *)local_1c8);
        ::std::
        vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
        ::vector(this_00,(vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
                          *)(auStack_198 + 0x10));
        bVar4 = CanPushdownFilter((vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_true>
                                   *)this_00,(vector<duckdb::ColumnBinding,_true> *)local_1c8);
        ::std::
        vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
        ::~vector(this_00);
        _Var15._M_head_impl =
             op[0x21].
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        if ((ulong)((long)op[0x22].
                          super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                          .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl -
                    (long)_Var15._M_head_impl >> 3) <= uVar13) {
          ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar13);
        }
        this_02 = (vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
                   *)&local_1e8;
        if (bVar4) {
          this_02 = (vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
                     *)&local_48;
        }
        ::std::
        vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>,std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,std::default_delete<duckdb::FilterPushdown::Filter>,true>>
                  (this_02,(unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>
                            *)((long)&(_Var15._M_head_impl)->_vptr_LogicalOperator + lVar14));
        if ((LogicalOperator *)local_1c8._0_8_ != (LogicalOperator *)0x0) {
          operator_delete((void *)local_1c8._0_8_);
        }
        uVar13 = uVar13 + 1;
        _Var15._M_head_impl =
             op[0x21].
             super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
             .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
        lVar14 = lVar14 + 8;
      } while (uVar13 < (ulong)((long)op[0x22].
                                      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                      ._M_t.
                                      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                                      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                                      _M_head_impl - (long)_Var15._M_head_impl >> 3));
    }
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(in_RDX);
    pvVar11 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](&pLVar5->children,0);
    _Var15._M_head_impl =
         (pvVar11->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pvVar11->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    Rewrite((FilterPushdown *)local_1c8,
            (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             *)(auStack_198 + 0x48));
    pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
             ::operator->(in_RDX);
    pvVar11 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
              ::operator[](&pLVar5->children,0);
    uVar3 = local_1c8._0_8_;
    local_1c8._0_8_ = (Optimizer *)0x0;
    _Var2._M_head_impl =
         (pvVar11->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pvVar11->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)uVar3
    ;
    if (_Var2._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    if ((Optimizer *)local_1c8._0_8_ != (Optimizer *)0x0) {
      (*(code *)((*(ClientContext **)local_1c8._0_8_)->
                super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    local_1c8._0_8_ = (Optimizer *)0x0;
    if (_Var15._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var15._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    local_1c8._0_8_ =
         op[0x21].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_1c8._8_8_ =
         op[0x22].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    local_1c8._16_8_ =
         op[0x23].
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    op[0x21].
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)
         local_1e8.
         super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    op[0x22].
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)
         local_1e8.
         super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    op[0x23].
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (LogicalOperator *)
         local_1e8.
         super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_1e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1e8.
    super__Vector_base<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
               *)local_1c8);
    _Var15._M_head_impl =
         (in_RDX->
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (in_RDX->
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    FinishPushdown(this,op);
    if (_Var15._M_head_impl != (LogicalOperator *)0x0) {
      (**(code **)((long)(_Var15._M_head_impl)->_vptr_LogicalOperator + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
    ::~vector(&local_1e8);
  }
LAB_00c92675:
  ::std::
  vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
  ::~vector((vector<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>,_std::allocator<std::unordered_set<duckdb::ColumnBinding,_duckdb::ColumnBindingHashFunction,_duckdb::ColumnBindingEquality,_std::allocator<duckdb::ColumnBinding>_>_>_>
             *)(auStack_198 + 0x10));
  ::std::
  vector<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::FilterPushdown::Filter,_std::default_delete<duckdb::FilterPushdown::Filter>,_true>_>_>
  ::~vector(&local_48);
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<std::reference_wrapper<duckdb::Expression>,_true>_>_>_>
  ::~_Rb_tree(&local_88);
  ::std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>,_std::_Select1st<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::FilterCombiner::ExpressionValueInformation,_true>_>_>_>
  ::~_Rb_tree(&local_b8);
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_f0);
  ::std::
  _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_128);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector(local_140);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> FilterPushdown::PushdownWindow(unique_ptr<LogicalOperator> op) {
	D_ASSERT(op->type == LogicalOperatorType::LOGICAL_WINDOW);
	auto &window = op->Cast<LogicalWindow>();
	FilterPushdown pushdown(optimizer, convert_mark_joins);

	// 1. Loop throguh the expressions, find the window expressions and investigate the partitions
	// if a filter applies to a partition in each window expression then you can push the filter
	// into the children.
	vector<column_binding_set_t> window_exprs_partition_bindings;
	for (auto &expr : window.expressions) {
		if (expr->GetExpressionClass() != ExpressionClass::BOUND_WINDOW) {
			continue;
		}
		auto &window_expr = expr->Cast<BoundWindowExpression>();
		auto &partitions = window_expr.partitions;
		if (partitions.empty()) {
			// If any window expression does not have partitions, we cannot push any filters.
			// all window expressions need to be partitioned by the same column
			// in order to push down the window.
			return FinishPushdown(std::move(op));
		}
		column_binding_set_t partition_bindings;
		// 2. Get the binding information of the partitions of the window expression
		for (auto &partition_expr : partitions) {
			switch (partition_expr->GetExpressionType()) {
			// TODO: Add expressions for function expressions like FLOOR, CEIL etc.
			case ExpressionType::BOUND_COLUMN_REF: {
				auto &partition_col = partition_expr->Cast<BoundColumnRefExpression>();
				partition_bindings.insert(partition_col.binding);
				break;
			}
			default:
				break;
			}
		}
		window_exprs_partition_bindings.push_back(partition_bindings);
	}

	if (window_exprs_partition_bindings.empty()) {
		return FinishPushdown(std::move(op));
	}

	vector<unique_ptr<Filter>> leftover_filters;
	// Loop through the filters. If a filter is on a partition in every window expression
	// it can be pushed down.
	for (idx_t i = 0; i < filters.size(); i++) {
		// the filter must be on all partition bindings
		vector<ColumnBinding> bindings;
		ExtractFilterBindings(*filters.at(i)->filter, bindings);
		if (CanPushdownFilter(window_exprs_partition_bindings, bindings)) {
			pushdown.filters.push_back(std::move(filters.at(i)));
		} else {
			leftover_filters.push_back(std::move(filters.at(i)));
		}
	}
	op->children[0] = pushdown.Rewrite(std::move(op->children[0]));
	filters = std::move(leftover_filters);
	return FinishPushdown(std::move(op));
}